

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitArrayNewSeg(PrintExpressionContents *this,ArrayNewSeg *curr)

{
  ostream *o;
  bool bVar1;
  HeapType type;
  ostream *this_00;
  Name name;
  TypeNamePrinter local_70;
  ArrayNewSeg *local_18;
  ArrayNewSeg *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (ArrayNewSeg *)this;
  bVar1 = printUnreachableReplacement(this,(Expression *)curr);
  if (!bVar1) {
    printMedium(this->o,"array.new_");
    if (local_18->op == NewData) {
      printMedium(this->o,"data");
    }
    else {
      if (local_18->op != NewElem) {
        handle_unreachable("unexpected op",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                           ,0x8e9);
      }
      printMedium(this->o,"elem");
    }
    std::operator<<(this->o,' ');
    anon_unknown_217::TypeNamePrinter::TypeNamePrinter(&local_70,this->o,this->wasm);
    type = wasm::Type::getHeapType
                     (&(local_18->super_SpecificExpression<(wasm::Expression::Id)64>).
                       super_Expression.type);
    anon_unknown_217::TypeNamePrinter::print(&local_70,type);
    anon_unknown_217::TypeNamePrinter::~TypeNamePrinter(&local_70);
    this_00 = std::operator<<(this->o," $");
    o = (ostream *)(local_18->segment).super_IString.str._M_len;
    name.super_IString.str._M_str = (char *)o;
    name.super_IString.str._M_len = (size_t)(local_18->segment).super_IString.str._M_str;
    wasm::operator<<((wasm *)this_00,o,name);
  }
  return;
}

Assistant:

void visitArrayNewSeg(ArrayNewSeg* curr) {
    if (printUnreachableReplacement(curr)) {
      return;
    }
    printMedium(o, "array.new_");
    switch (curr->op) {
      case NewData:
        printMedium(o, "data");
        break;
      case NewElem:
        printMedium(o, "elem");
        break;
      default:
        WASM_UNREACHABLE("unexpected op");
    }
    o << ' ';
    TypeNamePrinter(o, wasm).print(curr->type.getHeapType());
    o << " $" << curr->segment;
  }